

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O3

int __thiscall AActor::GetTeam(AActor *this)

{
  player_t *ppVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  ulong uVar4;
  
  ppVar1 = this->player;
  if (ppVar1 == (player_t *)0x0) {
    if (this->DesignatedTeam != 0xff) {
      return this->DesignatedTeam;
    }
    if (this->FriendPlayer == 0) {
      return 0xff;
    }
    uVar4 = (ulong)(this->FriendPlayer - 1);
    puVar2 = (undefined8 *)
             ((ulong)(((&DAT_00a602d8)[uVar4 * 0xa8] - 1 & 0x1e5) * 0x18) +
             (&DAT_00a602c8)[uVar4 * 0x54]);
    do {
      puVar3 = puVar2;
      puVar2 = (undefined8 *)*puVar3;
    } while (*(int *)(puVar3 + 1) != 0x1e5);
  }
  else {
    puVar2 = (undefined8 *)
             ((long)&((ppVar1->userinfo).
                      super_TMap<FName,_FBaseCVar_*,_THashTraits<FName>,_TValueTraits<FBaseCVar_*>_>
                     .Nodes)->Next +
             (ulong)(((ppVar1->userinfo).
                      super_TMap<FName,_FBaseCVar_*,_THashTraits<FName>,_TValueTraits<FBaseCVar_*>_>
                      .Size - 1 & 0x1e5) * 0x18));
    do {
      puVar3 = puVar2;
      puVar2 = (undefined8 *)*puVar3;
    } while (*(int *)(puVar3 + 1) != 0x1e5);
  }
  return *(int *)(puVar3[2] + 0x28);
}

Assistant:

int AActor::GetTeam()
{
	if (player)
	{
		return player->userinfo.GetTeam();
	}

	int myTeam = DesignatedTeam;

	// Check for monsters that belong to a player on the team but aren't part of the team themselves.
	if (myTeam == TEAM_NONE && FriendPlayer != 0)
	{
		myTeam = players[FriendPlayer - 1].userinfo.GetTeam();
	}
	return myTeam;

}